

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  int iVar2;
  uint64_t uVar3;
  code *pcVar4;
  TValue *top;
  ulong uVar5;
  void *pvVar6;
  TValue *pTVar7;
  uint uVar8;
  
  pvVar6 = L->cframe;
  if (pvVar6 != (void *)0x0) {
    uVar3 = (L->stack).ptr64;
    pTVar7 = L->base + -1;
    do {
      iVar2 = *(int *)(((ulong)pvVar6 & 0xfffffffffffffffc) + 8);
      if ((iVar2 < 0) && (top = (TValue *)((uint)-iVar2 + uVar3), pTVar7 < top)) {
        if (errcode == 0) {
          return pvVar6;
        }
        L->base = pTVar7 + 1;
        L->cframe = *(void **)((long)pvVar6 + 0x20);
LAB_0010f29c:
        unwindstack(L,top);
        return pvVar6;
      }
      if (pTVar7 <= (TValue *)(uVar3 + 8)) break;
      uVar5 = pTVar7->u64;
      uVar8 = (uint)uVar5 & 7;
      switch(uVar8) {
      default:
        pTVar7 = pTVar7 + (-2 - (ulong)*(byte *)(uVar5 - 3));
        goto LAB_0010f22e;
      case 1:
switchD_0010f1f1_caseD_1:
        if (errcode != 0) {
          L->base = (TValue *)((long)pTVar7 + (8 - (uVar5 & 0xfffffffffffffff8)));
          L->cframe = *(void **)((long)pvVar6 + 0x20);
          unwindstack(L,pTVar7 + -1);
          return (void *)0x0;
        }
        if (pvVar6 == stopcf) {
          return (void *)0x0;
        }
        pvVar6 = *(void **)((long)pvVar6 + 0x20);
        break;
      case 2:
        if (pTVar7[-3].u64 == 1) goto switchD_0010f1f1_caseD_1;
        break;
      case 3:
        break;
      case 5:
        if (((ulong)pvVar6 & 1) != 0) {
          if (errcode != 0) {
            pbVar1 = (byte *)((L->glref).ptr64 + 0x91);
            *pbVar1 = *pbVar1 & 0xef;
            L->cframe = (void *)0x0;
            L->status = (uint8_t)errcode;
            return pvVar6;
          }
          return pvVar6;
        }
        if (errcode == 0) {
          return pvVar6;
        }
        L->base = (TValue *)((long)pTVar7 + (8 - (uVar5 & 0xfffffffffffffff8)));
        L->cframe = *(void **)((long)pvVar6 + 0x20);
        top = pTVar7 + -1;
        goto LAB_0010f29c;
      case 6:
      case 7:
        if (errcode != 1) {
          if (errcode != 0) {
            if (uVar8 == 6) {
              pbVar1 = (byte *)((L->glref).ptr64 + 0x91);
              *pbVar1 = *pbVar1 & 0xef;
              uVar5 = pTVar7->u64;
            }
            pTVar7 = (TValue *)((long)pTVar7 + (8 - (uVar5 & 0xfffffffffffffff8)));
            L->base = pTVar7;
            L->cframe = pvVar6;
            unwindstack(L,pTVar7);
          }
          return (void *)((ulong)pvVar6 | 2);
        }
      }
      pTVar7 = (TValue *)((long)pTVar7 - (uVar5 & 0xfffffffffffffff8));
LAB_0010f22e:
    } while (pvVar6 != (void *)0x0);
  }
  if (errcode != 0) {
    pTVar7 = (TValue *)((L->stack).ptr64 + 0x10);
    L->base = pTVar7;
    L->cframe = (void *)0x0;
    unwindstack(L,pTVar7);
    pcVar4 = *(code **)((L->glref).ptr64 + 0x160);
    if (pcVar4 != (code *)0x0) {
      (*pcVar4)(L);
    }
    exit(1);
  }
  return L;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(G(L));
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}